

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O2

floatx80 propagateFloatx80NaN_m68k(floatx80 a,floatx80 b,float_status *status)

{
  bool bVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  floatx80 fVar9;
  
  uVar3 = b._8_4_;
  uVar4 = a._8_4_;
  bVar5 = 2;
  if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0 &&
      (~uVar4 & 0x7fff) == 0) {
    bVar5 = (((undefined1  [16])a & (undefined1  [16])0x4000000000000000) != (undefined1  [16])0x0
            || ((undefined1  [16])a & (undefined1  [16])0x3fffffffffffffff) == (undefined1  [16])0x0
            ) ^ 5;
  }
  if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
      (~uVar3 & 0x7fff) != 0) {
    bVar6 = false;
    bVar7 = false;
    bVar8 = true;
    bVar1 = false;
    if (bVar5 != 5) goto LAB_00647be8;
  }
  else {
    bVar6 = ((undefined1  [16])b & (undefined1  [16])0x3fffffffffffffff) != (undefined1  [16])0x0;
    bVar7 = ((undefined1  [16])b & (undefined1  [16])0x4000000000000000) == (undefined1  [16])0x0;
    bVar8 = bVar5 == 5;
    if (!bVar8 && (!bVar7 || !bVar6)) {
      bVar6 = false;
      bVar7 = false;
      goto LAB_00647be8;
    }
    bVar1 = !bVar8 || bVar7 && bVar6;
  }
  bVar7 = bVar1;
  bVar6 = bVar8;
  status->float_exception_flags = status->float_exception_flags | 1;
LAB_00647be8:
  if (status->default_nan_mode == '\0') {
    if (bVar5 < 4) {
      uVar2 = b.low | 0xc000000000000000;
      uVar4 = uVar3;
      if (!bVar7) {
        uVar2 = b.low;
      }
    }
    else {
      uVar2 = a.low | 0xc000000000000000;
      if (!bVar6) {
        uVar2 = a.low;
      }
    }
  }
  else {
    uVar2 = 0xffffffffffffffff;
    uVar4 = (uint)CONCAT62(b._10_6_,0x7fff);
  }
  fVar9._8_4_ = uVar4;
  fVar9.low = uVar2;
  fVar9._12_4_ = 0;
  return fVar9;
}

Assistant:

floatx80 propagateFloatx80NaN(floatx80 a, floatx80 b, float_status *status)
{
    flag aIsLargerSignificand;
    FloatClass a_cls, b_cls;

    /* This is not complete, but is good enough for pickNaN.  */
    a_cls = (!floatx80_is_any_nan(a)
             ? float_class_normal
             : floatx80_is_signaling_nan(a, status)
             ? float_class_snan
             : float_class_qnan);
    b_cls = (!floatx80_is_any_nan(b)
             ? float_class_normal
             : floatx80_is_signaling_nan(b, status)
             ? float_class_snan
             : float_class_qnan);

    if (is_snan(a_cls) || is_snan(b_cls)) {
        float_raise(float_flag_invalid, status);
    }

    if (status->default_nan_mode) {
        return floatx80_default_nan(status);
    }

    if (a.low < b.low) {
        aIsLargerSignificand = 0;
    } else if (b.low < a.low) {
        aIsLargerSignificand = 1;
    } else {
        aIsLargerSignificand = (a.high < b.high) ? 1 : 0;
    }

    if (pickNaN(a_cls, b_cls, aIsLargerSignificand)) {
        if (is_snan(b_cls)) {
            return floatx80_silence_nan(b, status);
        }
        return b;
    } else {
        if (is_snan(a_cls)) {
            return floatx80_silence_nan(a, status);
        }
        return a;
    }
}